

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableNT.cpp
# Opt level: O0

DataType __thiscall adios2::VariableNT::StructFieldType(VariableNT *this,size_t index)

{
  long *in_RDI;
  allocator *__rhs;
  allocator *__lhs;
  string local_128 [28];
  int in_stack_fffffffffffffef4;
  string *in_stack_fffffffffffffef8;
  string *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  string *in_stack_ffffffffffffff10;
  string local_e8 [39];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string *in_stack_ffffffffffffff68;
  VariableBase *in_stack_ffffffffffffff70;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [52];
  DataType local_4;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"in call to VariableNT::StructFieldType",&local_39);
  helper::CheckForNullptr<adios2::core::VariableBase>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  if (*(int *)(*in_RDI + 0x28) != 0x10) {
    __lhs = &local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"bindings::CXX11",__lhs);
    __rhs = &local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xffffffffffffff68,"VariableNT",__rhs);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"StructFieldType",&local_c1);
    adios2::ToString_abi_cxx11_((DataType)local_128);
    std::operator+((char *)__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                   (char *)__rhs);
    helper::Throw<std::runtime_error>
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
               in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  if (*(long *)(*in_RDI + 0x248) == 0) {
    local_4 = adios2::core::StructDefinition::Type(*(ulong *)(*in_RDI + 0x240));
  }
  else {
    local_4 = adios2::core::StructDefinition::Type(*(ulong *)(*in_RDI + 0x248));
  }
  return local_4;
}

Assistant:

DataType VariableNT::StructFieldType(const size_t index) const
{
    helper::CheckForNullptr(m_Variable, "in call to VariableNT::StructFieldType");
    if (m_Variable->m_Type != DataType::Struct)
    {
        helper::Throw<std::runtime_error>("bindings::CXX11", "VariableNT", "StructFieldType",
                                          "invalid data type " + ToString(m_Variable->m_Type) +
                                              ", only Struct type supports this API");
    }
    if (reinterpret_cast<core::VariableStruct *>(m_Variable)->m_ReadStructDefinition)
        return reinterpret_cast<core::VariableStruct *>(m_Variable)
            ->m_ReadStructDefinition->Type(index);
    else
        return reinterpret_cast<core::VariableStruct *>(m_Variable)
            ->m_WriteStructDefinition->Type(index);
}